

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ConcurrentAtomicCounterCase::
genComputeSource_abi_cxx11_(string *__return_storage_ptr__,void *this,bool evenOdd)

{
  _anonymous_namespace_ *this_00;
  ostream *poVar1;
  char *in_RCX;
  ostringstream buf;
  Context *local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "layout (binding = 1, std430) writeonly buffer IntermediateResults\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\thighp uint values[",0x13);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (local_198,*(int *)((long)this + 0x78) * *(int *)((long)this + 0x7c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} sb_ires;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"uniform highp uint u_callNdx;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\thighp uint dataNdx = u_callNdx * ",0x22);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x7c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"u + gl_GlobalInvocationID.x;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tif ((dataNdx % 2u) == ",0x17);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)!evenOdd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"u)\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t\tsb_ires.values[dataNdx] = atomicCounterIncrement(u_counter);\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::stringbuf::str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,local_1b8,in_RCX);
  if (local_1b8 != (Context *)local_1a8) {
    operator_delete(local_1b8,(ulong)((long)(Platform **)local_1a8._0_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string ConcurrentAtomicCounterCase::genComputeSource (bool evenOdd) const
{
	std::ostringstream buf;

	buf	<< "${GLSL_VERSION_DECL}\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout (binding = 1, std430) writeonly buffer IntermediateResults\n"
		<< "{\n"
		<< "	highp uint values[" << m_workSize * m_numCalls << "];\n"
		<< "} sb_ires;\n"
		<< "\n"
		<< "layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n"
		<< "uniform highp uint u_callNdx;\n"
		<< "\n"
		<< "void main ()\n"
		<< "{\n"
		<< "	highp uint dataNdx = u_callNdx * " << m_workSize << "u + gl_GlobalInvocationID.x;\n"
		<< "	if ((dataNdx % 2u) == " << ((evenOdd) ? (0) : (1)) << "u)\n"
		<< "		sb_ires.values[dataNdx] = atomicCounterIncrement(u_counter);\n"
		<< "}";

	return specializeShader(m_context, buf.str().c_str());
}